

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t psa_mac_verify_finish(psa_mac_operation_t *operation,uint8_t *mac,size_t mac_length)

{
  int iVar1;
  int local_6c;
  uint8_t local_68 [4];
  psa_status_t status;
  uint8_t actual_mac [64];
  size_t mac_length_local;
  uint8_t *mac_local;
  psa_mac_operation_t *operation_local;
  
  if (operation->alg == 0) {
    operation_local._4_4_ = -0x89;
  }
  else if (((byte)operation->field_0x4 >> 4 & 1) == 0) {
    actual_mac._56_8_ = mac_length;
    if (operation->mac_size == mac_length) {
      local_6c = psa_mac_finish_internal(operation,local_68,0x40);
      if ((local_6c == 0) && (iVar1 = safer_memcmp(mac,local_68,actual_mac._56_8_), iVar1 != 0)) {
        local_6c = -0x95;
      }
    }
    else {
      local_6c = -0x95;
    }
    if (local_6c == 0) {
      local_6c = psa_mac_abort(operation);
    }
    else {
      psa_mac_abort(operation);
    }
    mbedtls_platform_zeroize(local_68,0x40);
    operation_local._4_4_ = local_6c;
  }
  else {
    operation_local._4_4_ = -0x89;
  }
  return operation_local._4_4_;
}

Assistant:

psa_status_t psa_mac_verify_finish( psa_mac_operation_t *operation,
                                    const uint8_t *mac,
                                    size_t mac_length )
{
    uint8_t actual_mac[PSA_MAC_MAX_SIZE];
    psa_status_t status;

    if( operation->alg == 0 )
    {
        return( PSA_ERROR_BAD_STATE );
    }

    if( operation->is_sign )
    {
        return( PSA_ERROR_BAD_STATE );
    }
    if( operation->mac_size != mac_length )
    {
        status = PSA_ERROR_INVALID_SIGNATURE;
        goto cleanup;
    }

    status = psa_mac_finish_internal( operation,
                                      actual_mac, sizeof( actual_mac ) );
    if( status != PSA_SUCCESS )
        goto cleanup;

    if( safer_memcmp( mac, actual_mac, mac_length ) != 0 )
        status = PSA_ERROR_INVALID_SIGNATURE;

cleanup:
    if( status == PSA_SUCCESS )
        status = psa_mac_abort( operation );
    else
        psa_mac_abort( operation );

    mbedtls_platform_zeroize( actual_mac, sizeof( actual_mac ) );

    return( status );
}